

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_2::PassthroughTestInstance::PassthroughTestInstance
          (PassthroughTestInstance *this,Context *context,Params *params)

{
  Params *params_local;
  Context *context_local;
  PassthroughTestInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__PassthroughTestInstance_016b1f48;
  Params::Params(&this->m_params,params);
  return;
}

Assistant:

PassthroughTestInstance	(Context& context, const Params& params) : TestInstance(context), m_params(params) {}